

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

void shutdown_behavior_impl(_func_void_int_ptr *fd_fun)

{
  void *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ssize_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  char c;
  int fds [3];
  epoll_event event;
  epoll_event event_result;
  uint8_t data [512];
  undefined1 local_269;
  int local_268;
  int local_264;
  int local_260;
  undefined1 local_25c [24];
  epoll_event local_244 [33];
  
  iVar2 = epoll_create1(0x80000);
  if (iVar2 < 0) {
    pcVar7 = "ep >= 0";
    uVar8 = 0x601;
  }
  else {
    connector_epfd = iVar2;
    local_25c._12_8_ = fd_fun;
    (*fd_fun)(&local_268);
    connector_epfd = -1;
    local_269 = 0x2a;
    write(local_268,&local_269,1);
    local_25c._0_4_ = 5;
    local_25c._4_4_ = local_264;
    epoll_ctl(iVar2,1,local_264,(epoll_event *)local_25c);
    piVar5 = __errno_location();
    *piVar5 = 0;
    iVar4 = 0;
    __s = (void *)((long)&local_244[0].data + 4);
    do {
      iVar3 = epoll_wait(iVar2,local_244,1,-1);
      if (iVar3 != 1) {
        pcVar7 = "(n = epoll_wait(ep, &event_result, 1, -1)) == 1";
        uVar8 = 0x618;
        goto LAB_00108e4e;
      }
      if (local_244[0]._4_4_ != local_264) {
        pcVar7 = "event_result.data.fd == fds[1]";
        uVar8 = 0x61a;
        goto LAB_00108e4e;
      }
      if ((local_244[0].events & 1) == 0) {
        if (local_244[0].events == 4) {
          send(local_25c._4_4_,&local_269,1,0x4000);
          bVar1 = true;
        }
        else {
          if ((~local_244[0].events & 0x14) == 0 && (code *)local_25c._12_8_ == fd_domain_socket) {
            shutdown_behavior_impl_cold_3();
          }
          else if (local_244[0].events == 0x1c && (code *)local_25c._12_8_ == fd_tcp_socket) {
            shutdown_behavior_impl_cold_2();
          }
          else {
            if (((code *)local_25c._12_8_ != fd_tcp_socket) || (local_244[0].events != 0x14)) {
              microatf_fail_require
                        ("%s:%d: %p(%p/%p): events %x",
                         "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                         ,0x660,local_25c._12_8_,fd_domain_socket,fd_tcp_socket,local_244[0].events)
              ;
            }
            shutdown_behavior_impl_cold_1();
          }
          bVar1 = false;
        }
      }
      else {
        sVar6 = read(local_264,&local_269,1);
        if ((int)sVar6 != 1) {
          pcVar7 = "(n = (int)read(fds[1], &c, 1)) == 1";
          uVar8 = 0x621;
          goto LAB_00108e4e;
        }
        if (iVar4 < 5) {
          send(local_268,&local_269,1,0x4000);
        }
        else {
          if (iVar4 + 1 == 6) {
            send(local_268,&local_269,1,0x4000);
            shutdown(local_268,1);
            usleep(100000);
            bVar1 = true;
            iVar4 = 6;
            goto LAB_00108ced;
          }
          memset(__s,0,0x200);
          send(local_264,__s,0x200,0x4000);
          close(local_268);
          local_25c._0_4_ = 4;
          local_25c._4_4_ = local_264;
          iVar3 = epoll_ctl(iVar2,3,local_264,(epoll_event *)local_25c);
          if (iVar3 != 0) {
            pcVar7 = "epoll_ctl(ep, EPOLL_CTL_MOD, fds[1], &event) == 0";
            uVar8 = 0x635;
            goto LAB_00108e4e;
          }
          usleep(100000);
        }
        bVar1 = true;
        iVar4 = iVar4 + 1;
      }
LAB_00108ced:
    } while (bVar1);
    iVar4 = close(local_264);
    if (iVar4 == 0) {
      if ((local_260 == -1) || (iVar4 = close(local_260), iVar4 == 0)) {
        iVar2 = close(iVar2);
        if (iVar2 == 0) {
          return;
        }
        pcVar7 = "close(ep) == 0";
        uVar8 = 0x666;
      }
      else {
        pcVar7 = "fds[2] == -1 || close(fds[2]) == 0";
        uVar8 = 0x665;
      }
    }
    else {
      pcVar7 = "close(fds[1]) == 0";
      uVar8 = 0x664;
    }
  }
LAB_00108e4e:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar8,pcVar7);
}

Assistant:

static void
shutdown_behavior_impl(void (*fd_fun)(int fds[3]))
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	connector_epfd = ep;

	int fds[3];
	fd_fun(fds);

	connector_epfd = -1;

	int counter = 0;
	char c = 42;
	write(fds[0], &c, 1);

	struct epoll_event event;
	event.events = EPOLLOUT | EPOLLIN;
	event.data.fd = fds[1];
	epoll_ctl(ep, EPOLL_CTL_ADD, fds[1], &event);

	errno = 0;

	for (;;) {
		struct epoll_event event_result;
		int n;
		ATF_REQUIRE((n = epoll_wait(ep, &event_result, 1, -1)) == 1);

		ATF_REQUIRE(event_result.data.fd == fds[1]);

		// fprintf(stderr, "got event: %x %d\n",
		// (int)event_result.events,
		//     (int)event_result.events);

		if (event_result.events & EPOLLIN) {
			ATF_REQUIRE((n = (int)read(fds[1], &c, 1)) == 1);

			++counter;

			if (counter <= 5) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
			} else if (counter == 6) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
				shutdown(fds[0], SHUT_WR);

				usleep(100000);
			} else {
				uint8_t data[512] = { 0 };
				send(fds[1], &data, sizeof(data), MSG_NOSIGNAL);

				close(fds[0]);

				event.events = EPOLLOUT;
				event.data.fd = fds[1];
				ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_MOD, /**/
						fds[1], &event) == 0);

				usleep(100000);
			}

		} else if (event_result.events == EPOLLOUT) {
			send(event.data.fd, &c, 1, MSG_NOSIGNAL);
			// continue
		} else if (fd_fun == fd_domain_socket &&
		    (event_result.events & (EPOLLOUT | EPOLLHUP)) ==
			(EPOLLOUT | EPOLLHUP)) {
			// TODO(jan): Linux sets EPOLLERR in addition
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLERR | EPOLLHUP)) {
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLHUP)) {
			/*
			 * Rarely, we get here (no EPOLLERR). But don't fail
			 * the test. There is some non-determinism involved...
			 */
			fprintf(stderr, "no socket error\n");
			break;
		} else {
			ATF_REQUIRE_MSG(false, "%p(%p/%p): events %x",
			    (void *)fd_fun, (void *)fd_domain_socket,
			    (void *)fd_tcp_socket, event_result.events);
		}
	}

	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}